

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PCI.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::EBCellFlagFab>::PC_local_cpu
          (FabArray<amrex::EBCellFlagFab> *this,CPC *thecpc,FabArray<amrex::EBCellFlagFab> *src,
          int scomp,int dcomp,int ncomp,CpOp op)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  pointer this_00;
  size_type sVar4;
  type pvVar5;
  reference pvVar6;
  FabArrayBase *in_RDX;
  byte *in_RSI;
  FabArrayBase *in_RDI;
  undefined4 in_R9D;
  int in_stack_00000008;
  Dim3 offset_1;
  Array4<const_amrex::EBCellFlag> sfab_2;
  FabCopyTag<amrex::EBCellFlagFab> *tag_3;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *__range5_1;
  Dim3 offset;
  Array4<const_amrex::EBCellFlag> sfab_1;
  FabCopyTag<amrex::EBCellFlagFab> *tag_2;
  const_iterator __end0;
  const_iterator __begin0;
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *__range5;
  Array4<amrex::EBCellFlag> dfab_1;
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *tags;
  MFIter mfi;
  CopyComTag *tag_1;
  int i_1;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  loc_copy_tags;
  EBCellFlagFab *dfab;
  EBCellFlagFab *sfab;
  CopyComTag *tag;
  int i;
  bool is_thread_safe;
  int N_locs;
  undefined4 in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff890;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a4;
  BoxArray *in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  FabArrayBase *in_stack_fffffffffffff8b8;
  MFIter *in_stack_fffffffffffff8c0;
  anon_class_152_5_ce3dc6ec *in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8e4;
  Box *in_stack_fffffffffffff8e8;
  undefined1 auStack_6e0 [64];
  undefined8 local_6a0;
  int local_698;
  undefined8 local_690;
  int local_688;
  undefined8 local_67c;
  int local_674;
  Array4<const_amrex::EBCellFlag> local_670;
  reference local_630;
  FabCopyTag<amrex::EBCellFlagFab> *local_628;
  __normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  local_620;
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *local_618;
  undefined1 local_610 [52];
  int in_stack_fffffffffffffa24;
  int in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa30;
  int in_stack_fffffffffffffa34;
  Box *in_stack_fffffffffffffa38;
  BaseFab<amrex::EBCellFlag> *in_stack_fffffffffffffa40;
  BaseFab<amrex::EBCellFlag> *in_stack_fffffffffffffa48;
  Array4<const_amrex::EBCellFlag> local_558;
  reference local_518;
  FabCopyTag<amrex::EBCellFlagFab> *local_510;
  __normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  local_508;
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *local_500;
  undefined1 local_4f8 [64];
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *local_4b8;
  MFIter local_4b0;
  int local_440 [2];
  int local_438;
  EBCellFlagFab *local_430;
  undefined8 uStack_428;
  undefined4 uStack_420;
  undefined4 local_41c;
  undefined4 uStack_418;
  undefined8 uStack_414;
  int local_40c [2];
  int local_404;
  reference local_400;
  int local_3f4;
  int in_stack_fffffffffffffd00;
  int local_2c8;
  IntVect local_278;
  undefined4 local_26c;
  IntVect *local_268;
  undefined4 local_25c;
  IntVect *local_258;
  undefined4 local_24c;
  IntVect *local_248;
  EBCellFlagFab *local_240;
  EBCellFlagFab *local_238;
  undefined8 local_230;
  int local_228;
  IntVect *local_220;
  int local_214;
  int iStack_210;
  int local_20c;
  undefined8 local_208;
  int local_200;
  IntVect *local_1f8;
  int local_1ec;
  int iStack_1e8;
  int local_1e4;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  EBCellFlag *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  EBCellFlag *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  this_00 = std::
            unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
            ::operator->((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                          *)0x122349b);
  sVar4 = std::
          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
          ::size(this_00);
  iVar3 = (int)sVar4;
  if (iVar3 != 0) {
    if ((*in_RSI & 1) == 0) {
      FabArrayBase::boxArray(in_RDI);
      FabArrayBase::DistributionMap(in_RDI);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
      ::LayoutData((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                   in_stack_fffffffffffff8a8,
                   (DistributionMapping *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      for (local_3f4 = 0; local_3f4 < iVar3; local_3f4 = local_3f4 + 1) {
        pvVar5 = std::
                 unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                 ::operator*((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                              *)in_stack_fffffffffffff890);
        local_400 = std::
                    vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                    ::operator[](pvVar5,(long)local_3f4);
        if (((in_RDI != in_RDX) || (local_400->dstIndex != local_400->srcIndex)) ||
           (bVar2 = Box::operator!=((Box *)in_stack_fffffffffffff890,
                                    (Box *)CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888)), bVar2)) {
          in_stack_fffffffffffff8c0 =
               (MFIter *)
               LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
               ::operator[]((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                             *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
          local_430 = fabPtr(in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
          uStack_428 = *(undefined8 *)(local_400->dbox).smallend.vect;
          uVar1 = *(undefined8 *)((local_400->dbox).smallend.vect + 2);
          uStack_414 = *(undefined8 *)((local_400->dbox).bigend.vect + 2);
          uStack_418 = (undefined4)((ulong)*(undefined8 *)(local_400->dbox).bigend.vect >> 0x20);
          uStack_420 = (undefined4)uVar1;
          local_41c = (undefined4)((ulong)uVar1 >> 0x20);
          in_stack_fffffffffffff8b8 = (FabArrayBase *)Box::smallEnd(&local_400->sbox);
          local_268 = Box::smallEnd(&local_400->dbox);
          local_24c = 0;
          local_25c = 1;
          local_26c = 2;
          local_258 = local_268;
          local_248 = local_268;
          IntVect::IntVect(&local_278,
                           *(int *)&in_stack_fffffffffffff8b8->_vptr_FabArrayBase -
                           local_268->vect[0],
                           *(int *)((long)&in_stack_fffffffffffff8b8->_vptr_FabArrayBase + 4) -
                           local_268->vect[1],
                           (in_stack_fffffffffffff8b8->boxarray).m_bat.m_bat_type -
                           local_268->vect[2]);
          local_438 = local_278.vect[2];
          local_440[0] = local_278.vect[0];
          local_440[1] = local_278.vect[1];
          local_404 = local_278.vect[2];
          local_40c[0] = local_278.vect[0];
          local_40c[1] = local_278.vect[1];
          std::
          vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
          ::push_back((vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                       *)in_stack_fffffffffffff890,
                      (value_type *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        }
      }
      MFIter::MFIter(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                     (uchar)((uint)in_stack_fffffffffffff8b4 >> 0x18));
      while (bVar2 = MFIter::isValid(&local_4b0), bVar2) {
        local_4b8 = LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                    ::operator[]((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                                  *)in_stack_fffffffffffff890,
                                 (MFIter *)
                                 CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        array<amrex::EBCellFlagFab,_0>
                  (in_stack_fffffffffffff898,(MFIter *)in_stack_fffffffffffff890);
        if (in_stack_00000008 == 0) {
          local_500 = local_4b8;
          local_508._M_current =
               (FabCopyTag<amrex::EBCellFlagFab> *)
               std::
               vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
               ::begin((vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                        *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          local_510 = (FabCopyTag<amrex::EBCellFlagFab> *)
                      std::
                      vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                      ::end((vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                             *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                                     *)in_stack_fffffffffffff890,
                                    (__normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                   ), bVar2) {
            local_518 = __gnu_cxx::
                        __normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                        ::operator*(&local_508);
            local_238 = local_518->sfab;
            local_198 = (local_238->super_BaseFab<amrex::EBCellFlag>).dptr;
            local_1a0 = &(local_238->super_BaseFab<amrex::EBCellFlag>).domain;
            local_1a4 = (local_238->super_BaseFab<amrex::EBCellFlag>).nvar;
            local_14c = 0;
            local_178 = (local_1a0->smallend).vect[0];
            local_15c = 1;
            iStack_174 = (local_238->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
            local_1c0.x = (local_1a0->smallend).vect[0];
            local_1c0.y = (local_1a0->smallend).vect[1];
            local_16c = 2;
            local_1c0.z = (local_238->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
            local_f8 = &(local_238->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
            local_fc = 0;
            local_128 = local_f8->vect[0] + 1;
            local_108 = &(local_238->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
            local_10c = 1;
            iStack_124 = (local_238->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
            local_118 = &(local_238->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
            local_11c = 2;
            local_1e0.z = (local_238->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
            local_1e0.y = iStack_124;
            local_1e0.x = local_128;
            local_1d0._0_8_ = local_1e0._0_8_;
            local_1d0.z = local_1e0.z;
            local_1b0._0_8_ = local_1c0._0_8_;
            local_1b0.z = local_1c0.z;
            local_190._0_8_ = local_1c0._0_8_;
            local_190.z = local_1c0.z;
            local_180 = local_1a0;
            local_170 = local_1c0.z;
            local_168 = local_1a0;
            local_158 = local_1a0;
            local_148 = local_1a0;
            local_140._0_8_ = local_1e0._0_8_;
            local_140.z = local_1e0.z;
            local_130 = local_1a0;
            local_120 = local_1e0.z;
            Array4<const_amrex::EBCellFlag>::Array4
                      (&local_558,local_198,&local_1b0,&local_1d0,local_1a4);
            local_1f8 = &local_518->offset;
            local_1ec = local_1f8->vect[0];
            iStack_1e8 = (local_518->offset).vect[1];
            local_208 = *(undefined8 *)local_1f8->vect;
            local_200 = (local_518->offset).vect[2];
            local_1e4 = local_200;
            memcpy(local_610,local_4f8,0x3c);
            memcpy(&stack0xfffffffffffffa38,&local_558,0x3c);
            LoopConcurrentOnCpu<amrex::FabArray<amrex::EBCellFlagFab>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::EBCellFlagFab>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_1_>
                      (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e4,in_stack_fffffffffffff8d8
                      );
            __gnu_cxx::
            __normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
            ::operator++(&local_508);
          }
        }
        else {
          local_618 = local_4b8;
          local_620._M_current =
               (FabCopyTag<amrex::EBCellFlagFab> *)
               std::
               vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
               ::begin((vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                        *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          local_628 = (FabCopyTag<amrex::EBCellFlagFab> *)
                      std::
                      vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                      ::end((vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                             *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                                     *)in_stack_fffffffffffff890,
                                    (__normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                   ), bVar2) {
            local_630 = __gnu_cxx::
                        __normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                        ::operator*(&local_620);
            local_240 = local_630->sfab;
            local_a8 = (local_240->super_BaseFab<amrex::EBCellFlag>).dptr;
            local_b0 = &(local_240->super_BaseFab<amrex::EBCellFlag>).domain;
            local_b4 = (local_240->super_BaseFab<amrex::EBCellFlag>).nvar;
            local_5c = 0;
            local_88 = (local_b0->smallend).vect[0];
            local_6c = 1;
            iStack_84 = (local_240->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
            local_d0.x = (local_b0->smallend).vect[0];
            local_d0.y = (local_b0->smallend).vect[1];
            local_7c = 2;
            local_d0.z = (local_240->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
            local_8 = &(local_240->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
            local_c = 0;
            local_38 = local_8->vect[0] + 1;
            local_18 = &(local_240->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
            local_1c = 1;
            iStack_34 = (local_240->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
            local_28 = &(local_240->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
            local_2c = 2;
            local_f0.z = (local_240->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
            local_f0.y = iStack_34;
            local_f0.x = local_38;
            local_e0._0_8_ = local_f0._0_8_;
            local_e0.z = local_f0.z;
            local_c0._0_8_ = local_d0._0_8_;
            local_c0.z = local_d0.z;
            local_a0._0_8_ = local_d0._0_8_;
            local_a0.z = local_d0.z;
            local_90 = local_b0;
            local_80 = local_d0.z;
            local_78 = local_b0;
            local_68 = local_b0;
            local_58 = local_b0;
            local_50._0_8_ = local_f0._0_8_;
            local_50.z = local_f0.z;
            local_40 = local_b0;
            local_30 = local_f0.z;
            Array4<const_amrex::EBCellFlag>::Array4
                      (&local_670,local_a8,&local_c0,&local_e0,local_b4);
            local_220 = &local_630->offset;
            local_214 = local_220->vect[0];
            iStack_210 = (local_630->offset).vect[1];
            local_690 = *(undefined8 *)local_220->vect;
            local_688 = (local_630->offset).vect[2];
            in_stack_fffffffffffff898 = (FabArray<amrex::EBCellFlagFab> *)&local_630->dbox;
            local_67c = local_690;
            local_674 = local_688;
            local_230 = local_690;
            local_228 = local_688;
            local_20c = local_688;
            memcpy(&stack0xfffffffffffff8d8,local_4f8,0x3c);
            memcpy(auStack_6e0,&local_670,0x3c);
            local_6a0 = local_67c;
            local_698 = local_674;
            LoopConcurrentOnCpu<amrex::FabArray<amrex::EBCellFlagFab>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::EBCellFlagFab>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_2_>
                      (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e4,in_stack_fffffffffffff8d8
                      );
            __gnu_cxx::
            __normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
            ::operator++(&local_620);
          }
        }
        MFIter::operator++(&local_4b0);
      }
      MFIter::~MFIter((MFIter *)in_stack_fffffffffffff890);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
      ::~LayoutData((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                     *)in_stack_fffffffffffff890);
    }
    else {
      for (local_2c8 = 0; local_2c8 < iVar3; local_2c8 = local_2c8 + 1) {
        pvVar5 = std::
                 unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                 ::operator*((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                              *)in_stack_fffffffffffff890);
        pvVar6 = std::
                 vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                 ::operator[](pvVar5,(long)local_2c8);
        if (((in_RDI != in_RDX) || (pvVar6->dstIndex != pvVar6->srcIndex)) ||
           (bVar2 = Box::operator!=((Box *)in_stack_fffffffffffff890,
                                    (Box *)CONCAT44(in_stack_fffffffffffff88c,
                                                    in_stack_fffffffffffff888)), bVar2)) {
          operator[](in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
          get(in_stack_fffffffffffff890,in_stack_fffffffffffff88c);
          in_stack_fffffffffffff888 = in_R9D;
          if (in_stack_00000008 == 0) {
            BaseFab<amrex::EBCellFlag>::copy<(amrex::RunOn)1>
                      (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38
                       ,in_stack_fffffffffffffa34,
                       (Box *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                       in_stack_fffffffffffffa24,in_stack_fffffffffffffd00);
          }
          else {
            BaseFab<amrex::EBCellFlag>::plus<(amrex::RunOn)1>
                      (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38
                       ,(Box *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                       in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28,in_stack_fffffffffffffd00
                      );
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
FabArray<FAB>::PC_local_cpu (const CPC& thecpc, FabArray<FAB> const& src,
                             int scomp, int dcomp, int ncomp, CpOp op)
{
    int N_locs = thecpc.m_LocTags->size();
    if (N_locs == 0) return;
    bool is_thread_safe = thecpc.m_threadsafe_loc;

    if (is_thread_safe)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                // avoid self copy or plus
                const FAB* sfab = &(src[tag.srcIndex]);
                      FAB* dfab = &(get(tag.dstIndex));
                if (op == FabArrayBase::COPY)
                {
                    dfab->template copy<RunOn::Host>(*sfab, tag.sbox, scomp, tag.dbox, dcomp, ncomp);
                }
                else
                {
                    dfab->template plus<RunOn::Host>(*sfab, tag.sbox, tag.dbox, scomp, dcomp, ncomp);
                }
            }
        }
    }
    else
    {
        LayoutData<Vector<FabCopyTag<FAB> > > loc_copy_tags(boxArray(),DistributionMap());
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                loc_copy_tags[tag.dstIndex].push_back
                    ({src.fabPtr(tag.srcIndex), tag.dbox, tag.sbox.smallEnd()-tag.dbox.smallEnd()});
            }
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            const auto& tags = loc_copy_tags[mfi];
            auto dfab = this->array(mfi);
            if (op == FabArrayBase::COPY)
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) = sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
            else
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) += sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
        }
    }
}